

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Expression * __thiscall CFG::Block::Render(Block *this,RelooperBuilder *Builder,bool InLoop)

{
  uint uVar1;
  Name default_;
  Name name;
  RelooperBuilder *pRVar2;
  bool bVar3;
  int iVar4;
  LocalSet *item;
  size_t sVar5;
  size_type sVar6;
  type *ppBVar7;
  pointer ppVar8;
  Branch **ppBVar9;
  Block *pBVar10;
  pointer ppVar11;
  undefined4 extraout_var;
  iterator right;
  size_type sVar12;
  reference ppIVar13;
  reference ppVar14;
  type *ppBVar15;
  undefined4 extraout_var_00;
  ExpressionList *pEVar16;
  Break *item_00;
  IString *this_00;
  type this_01;
  reference puVar17;
  reference this_02;
  Switch *item_01;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_03;
  bool local_452;
  byte local_451;
  bool local_3c2;
  byte local_3c1;
  iterator iStack_370;
  uint Value_1;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  Name *Value;
  iterator __end5;
  iterator __begin5;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range5;
  BasicType local_324;
  Block *local_320;
  Block *NextOuter;
  Block *local_310;
  Expression *CurrContent_1;
  undefined1 local_300 [6];
  bool HasFusedContent_1;
  bool SetCurrLabel_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  Name local_2a0;
  undefined1 local_290 [8];
  Name CurrName;
  type *Details_2;
  type *Target_2;
  _Self local_268;
  iterator __end2;
  iterator __begin2;
  BlockBranchMap *__range2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> Table;
  Block *Inner;
  Block *Outer;
  map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  BlockNameMap;
  undefined1 auStack_1d8 [8];
  Name SwitchLeave;
  undefined1 auStack_1a8 [8];
  Name SwitchDefault;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> Base;
  If *curr;
  Unary *Now_2;
  If *Now_1;
  Block *local_108;
  Expression *Now;
  _Self local_f8;
  byte local_e9;
  Block *pBStack_e8;
  bool IsDefault;
  Expression *CurrContent;
  bool HasFusedContent;
  iterator iStack_d8;
  bool SetCurrLabel;
  Branch *local_d0;
  Branch *Details_1;
  Block *Target_1;
  _Self local_b0;
  iterator iter;
  Expression *RemainingConditions;
  vector<wasm::If_*,_std::allocator<wasm::If_*>_> finalizeStack;
  If *CurrIf;
  Expression *Root;
  type *Details;
  type *Target;
  _Self local_60;
  iterator __end1;
  iterator __begin1;
  BlockBranchMap *__range1;
  Block *DefaultTarget;
  MultipleShape *Fused;
  Block *pBStack_30;
  bool SetLabel;
  Block *Ret;
  RelooperBuilder *pRStack_20;
  bool InLoop_local;
  RelooperBuilder *Builder_local;
  Block *this_local;
  
  Ret._7_1_ = InLoop;
  pRStack_20 = Builder;
  Builder_local = (RelooperBuilder *)this;
  pBStack_30 = ::wasm::Builder::makeBlock(&Builder->super_Builder,(Expression *)0x0);
  if (((this->IsCheckedMultipleEntry & 1U) != 0) && ((Ret._7_1_ & 1) != 0)) {
    pEVar16 = &pBStack_30->list;
    item = RelooperBuilder::makeSetLabel(pRStack_20,0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar16->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
  }
  if (this->Code != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBStack_30->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               this->Code);
  }
  sVar5 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::size(&this->ProcessedBranchesOut);
  if (sVar5 == 0) {
    ::wasm::Block::finalize(pBStack_30);
    return (Expression *)pBStack_30;
  }
  Fused._7_1_ = 1;
  DefaultTarget = (Block *)Shape::IsMultiple(this->Parent->Next);
  if ((DefaultTarget != (Block *)0x0) &&
     (this->Parent->Next = this->Parent->Next->Next, (Fused._7_1_ & 1) != 0)) {
    sVar6 = std::
            map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
            ::size((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                    *)&(DefaultTarget->BranchesOut).Map._M_h._M_rehash_policy);
    sVar5 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::size(&this->ProcessedBranchesOut)
    ;
    if ((sVar6 == sVar5) && (this->SwitchCondition == (Expression *)0x0)) {
      Fused._7_1_ = 0;
    }
  }
  __range1 = (BlockBranchMap *)0x0;
  __end1 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(&this->ProcessedBranchesOut)
  ;
  local_60._M_node =
       (_List_node_base *)
       ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(&this->ProcessedBranchesOut);
  while (bVar3 = std::operator!=(&__end1,&local_60), bVar3) {
    ppVar14 = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*(&__end1);
    ppBVar15 = std::get<0ul,CFG::Block*const,CFG::Branch*>(ppVar14);
    ppBVar7 = std::get<1ul,CFG::Block*const,CFG::Branch*>(ppVar14);
    if (((this->SwitchCondition == (Expression *)0x0) &&
        ((*ppBVar7)->Condition == (Expression *)0x0)) ||
       ((this->SwitchCondition != (Expression *)0x0 &&
        (bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&(*ppBVar7)->SwitchValues),
        !bVar3)))) {
      if (__range1 != (BlockBranchMap *)0x0) {
        __assert_fail("!DefaultTarget && \"block has branches without a default (nullptr for the \" \"condition)\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0xe4,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
      __range1 = (BlockBranchMap *)*ppBVar15;
    }
    std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end1);
  }
  if (__range1 == (BlockBranchMap *)0x0) {
    __assert_fail("DefaultTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                  ,0xe9,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
  }
  CurrIf = (If *)0x0;
  if (this->SwitchCondition == (Expression *)0x0) {
    finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::vector
              ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&RemainingConditions);
    iter._M_node = (_List_node_base *)0x0;
    local_b0._M_node =
         (_List_node_base *)
         ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(&this->ProcessedBranchesOut);
    do {
      iStack_d8 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end
                            (&this->ProcessedBranchesOut);
      bVar3 = std::operator!=(&local_b0,&stack0xffffffffffffff28);
      if (bVar3) {
        ppVar8 = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator->
                           (&local_b0);
        Details_1 = (Branch *)ppVar8->first;
        if ((BlockBranchMap *)Details_1 != __range1) {
          ppVar8 = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator->
                             (&local_b0);
          local_d0 = ppVar8->second;
          if (local_d0->Condition == (Expression *)0x0) {
            __assert_fail("Details->Condition",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                          ,0x102,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
          }
          goto LAB_01f5e1d8;
        }
      }
      else {
        Details_1 = (Branch *)__range1;
        ppBVar9 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                            (&this->ProcessedBranchesOut,(Block **)&__range1);
        local_d0 = *ppBVar9;
LAB_01f5e1d8:
        local_3c1 = 0;
        if ((Fused._7_1_ & 1) != 0) {
          local_3c1 = *(byte *)&Details_1[9].Ancestor;
        }
        CurrContent._7_1_ = local_3c1 & 1;
        local_3c2 = false;
        if (DefaultTarget != (Block *)0x0) {
          local_3c2 = contains<std::map<int,CFG::Shape*,std::less<int>,std::allocator<std::pair<int_const,CFG::Shape*>>>,int>
                                ((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                                  *)&(DefaultTarget->BranchesOut).Map._M_h._M_rehash_policy,
                                 (int *)&Details_1[8].Condition);
        }
        CurrContent._6_1_ = local_3c2;
        if (local_3c2 != false) {
          if (local_d0->Type != Break) {
            __assert_fail("Details->Type == Branch::Break",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                          ,0x10a,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
          }
          local_d0->Type = Direct;
        }
        pBStack_e8 = (Block *)0x0;
        local_f8._M_node =
             (_List_node_base *)
             ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(&this->ProcessedBranchesOut)
        ;
        local_e9 = std::operator==(&local_b0,&local_f8);
        if ((((((CurrContent._7_1_ & 1) != 0) || (local_d0->Type != Direct)) ||
             ((CurrContent._6_1_ & 1) != 0)) || (local_d0->Code != (Expression *)0x0)) &&
           (pBVar10 = (Block *)Branch::Render(local_d0,pRStack_20,(Block *)Details_1,
                                              (bool)(CurrContent._7_1_ & 1)), pRVar2 = pRStack_20,
           pBStack_e8 = pBVar10, (CurrContent._6_1_ & 1) != 0)) {
          Now = (Expression *)
                std::
                map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                ::find((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                        *)&(DefaultTarget->BranchesOut).Map._M_h._M_rehash_policy,
                       (key_type_conflict1 *)&Details_1[8].Condition);
          ppVar11 = std::_Rb_tree_iterator<std::pair<const_int,_CFG::Shape_*>_>::operator->
                              ((_Rb_tree_iterator<std::pair<const_int,_CFG::Shape_*>_> *)&Now);
          iVar4 = (*ppVar11->second->_vptr_Shape[2])
                            (ppVar11->second,pRStack_20,(ulong)(Ret._7_1_ & 1));
          pBStack_e8 = ::wasm::Builder::blockify
                                 (&pRVar2->super_Builder,(Expression *)pBVar10,
                                  (Expression *)CONCAT44(extraout_var,iVar4));
        }
        if (pBStack_e8 == (Block *)0x0) {
          right._M_node =
               (_List_node_base *)
               ::wasm::Builder::makeUnary(&pRStack_20->super_Builder,EqZInt32,local_d0->Condition);
          if (iter._M_node != (_List_node_base *)0x0) {
            right._M_node =
                 (_List_node_base *)
                 ::wasm::Builder::makeBinary
                           (&pRStack_20->super_Builder,AndInt32,iter._M_node,
                            (Expression *)right._M_node);
          }
        }
        else if ((local_e9 & 1) == 0) {
          Now_2 = (Unary *)::wasm::Builder::makeIf
                                     (&pRStack_20->super_Builder,local_d0->Condition,
                                      (Expression *)pBStack_e8,(Expression *)0x0);
          std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
                    ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&RemainingConditions,
                     (value_type *)&Now_2);
          if (finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            if (CurrIf != (If *)0x0) {
              __assert_fail("!Root",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                            ,0x12d,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
            }
            CurrIf = (If *)Now_2;
            right = iter;
            finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)Now_2;
          }
          else {
            finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[4] = (If *)Now_2;
            ::wasm::If::finalize
                      ((If *)finalizeStack.
                             super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
            right = iter;
            finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)Now_2;
          }
        }
        else {
          if (iter._M_node == (_List_node_base *)0x0) {
            local_108 = pBStack_e8;
          }
          else {
            local_108 = (Block *)::wasm::Builder::makeIf
                                           (&pRStack_20->super_Builder,(Expression *)iter._M_node,
                                            (Expression *)pBStack_e8,(Expression *)0x0);
            Now_1 = ::wasm::Expression::cast<wasm::If>((Expression *)local_108);
            std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
                      ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&RemainingConditions,
                       &Now_1);
          }
          if (finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            if (CurrIf != (If *)0x0) {
              __assert_fail("!Root",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                            ,0x123,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
            }
            CurrIf = (If *)local_108;
            right._M_node = iter._M_node;
          }
          else {
            finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[4] = (If *)local_108;
            ::wasm::If::finalize
                      ((If *)finalizeStack.
                             super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
            right = iter;
          }
        }
        iter._M_node = right._M_node;
        if ((local_e9 & 1) != 0) goto LAB_01f5e675;
      }
      std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&local_b0,0);
    } while( true );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"switch$",&local_171);
  std::__cxx11::to_string((string *)&SwitchDefault.super_IString.str._M_str,this->Id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 &local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &SwitchDefault.super_IString.str._M_str);
  std::__cxx11::string::~string((string *)&SwitchDefault.super_IString.str._M_str);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &SwitchLeave.super_IString.str._M_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 "$default");
  ::wasm::Name::Name((Name *)auStack_1a8,(string *)&SwitchLeave.super_IString.str._M_str);
  std::__cxx11::string::~string((string *)&SwitchLeave.super_IString.str._M_str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 "$leave");
  ::wasm::Name::Name((Name *)auStack_1d8,
                     (string *)&BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&BlockNameMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  ::map((map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
         *)&Outer);
  Inner = ::wasm::Builder::makeBlock(&pRStack_20->super_Builder,(Expression *)0x0);
  Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Inner;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
  __end2 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(&this->ProcessedBranchesOut)
  ;
  local_268._M_node =
       (_List_node_base *)
       ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(&this->ProcessedBranchesOut);
  while (bVar3 = std::operator!=(&__end2,&local_268), bVar3) {
    ppVar14 = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*(&__end2);
    ppBVar15 = std::get<0ul,CFG::Block*const,CFG::Branch*>(ppVar14);
    CurrName.super_IString.str._M_str = (char *)std::get<1ul,CFG::Block*const,CFG::Branch*>(ppVar14)
    ;
    ::wasm::Name::Name((Name *)local_290);
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)(*(long *)CurrName.super_IString.str._M_str + 0x18));
    if (bVar3) {
      std::operator+(&local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     "$case$");
      std::__cxx11::to_string((string *)local_300,(*ppBVar15)->Id);
      std::operator+(&local_2c0,&local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300)
      ;
      ::wasm::Name::Name(&local_2a0,&local_2c0);
      ::wasm::Name::operator=((Name *)local_290,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)local_300);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    else {
      ::wasm::Name::operator=((Name *)local_290,(Name *)auStack_1a8);
    }
    local_451 = 0;
    if ((Fused._7_1_ & 1) != 0) {
      local_451 = (*ppBVar15)->IsCheckedMultipleEntry;
    }
    CurrContent_1._7_1_ = local_451 & 1;
    local_452 = false;
    if (DefaultTarget != (Block *)0x0) {
      local_452 = contains<std::map<int,CFG::Shape*,std::less<int>,std::allocator<std::pair<int_const,CFG::Shape*>>>,int>
                            ((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                              *)&(DefaultTarget->BranchesOut).Map._M_h._M_rehash_policy,
                             &(*ppBVar15)->Id);
    }
    CurrContent_1._6_1_ = local_452;
    if (local_452 != false) {
      if (*(int *)(*(long *)CurrName.super_IString.str._M_str + 8) != 1) {
        __assert_fail("Details->Type == Branch::Break",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x15e,"wasm::Expression *CFG::Block::Render(RelooperBuilder &, bool)");
      }
      *(undefined4 *)(*(long *)CurrName.super_IString.str._M_str + 8) = 0;
    }
    local_310 = (Block *)0x0;
    if (((((CurrContent_1._7_1_ & 1) != 0) ||
         (*(int *)(*(long *)CurrName.super_IString.str._M_str + 8) != 0)) ||
        ((local_452 != false || (*(long *)(*(long *)CurrName.super_IString.str._M_str + 0x20) != 0))
        )) && (pBVar10 = (Block *)Branch::Render(*(Branch **)CurrName.super_IString.str._M_str,
                                                 pRStack_20,*ppBVar15,
                                                 (bool)(CurrContent_1._7_1_ & 1)),
              pRVar2 = pRStack_20, local_310 = pBVar10, (CurrContent_1._6_1_ & 1) != 0)) {
      NextOuter = (Block *)std::
                           map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                           ::find((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                                   *)&(DefaultTarget->BranchesOut).Map._M_h._M_rehash_policy,
                                  &(*ppBVar15)->Id);
      ppVar11 = std::_Rb_tree_iterator<std::pair<const_int,_CFG::Shape_*>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_int,_CFG::Shape_*>_> *)&NextOuter);
      iVar4 = (*ppVar11->second->_vptr_Shape[2])(ppVar11->second,pRStack_20,(ulong)(Ret._7_1_ & 1));
      local_310 = ::wasm::Builder::blockify
                            (&pRVar2->super_Builder,(Expression *)pBVar10,
                             (Expression *)CONCAT44(extraout_var_00,iVar4));
    }
    if (local_310 == (Block *)0x0) {
      ::wasm::Name::operator=((Name *)local_290,(Name *)auStack_1d8);
      bVar3 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)(*(long *)CurrName.super_IString.str._M_str + 0x18));
      if (!bVar3) {
        __end5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                           ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
        Value = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                           *)&Value), bVar3) {
          this_00 = &__gnu_cxx::
                     __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                     ::operator*(&__end5)->super_IString;
          bVar3 = ::wasm::IString::operator==(this_00,(IString *)auStack_1a8);
          if (bVar3) {
            ::wasm::Name::operator=((Name *)this_00,(Name *)auStack_1d8);
          }
          __gnu_cxx::
          __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
          operator++(&__end5);
        }
        ::wasm::Name::operator=((Name *)auStack_1a8,(Name *)auStack_1d8);
      }
    }
    else {
      local_320 = ::wasm::Builder::makeBlock(&pRStack_20->super_Builder,(Expression *)0x0);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(local_320->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)Inner);
      ::wasm::Name::operator=(&Inner->name,(Name *)local_290);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(local_320->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)local_310);
      local_324 = unreachable;
      bVar3 = ::wasm::Type::operator!=
                        (&(local_310->super_SpecificExpression<(wasm::Expression::Id)1>).
                          super_Expression.type,&local_324);
      if (bVar3) {
        pEVar16 = &local_320->list;
        name.super_IString.str._M_str = (char *)SwitchLeave.super_IString.str._M_len;
        name.super_IString.str._M_len = (size_t)auStack_1d8;
        item_00 = ::wasm::Builder::makeBreak
                            (&pRStack_20->super_Builder,name,(Expression *)0x0,(Expression *)0x0);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar16->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)item_00);
      }
      Inner = local_320;
    }
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)(*(long *)CurrName.super_IString.str._M_str + 0x18));
    if (bVar3) {
      this_01 = std::
                unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator*((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(*(long *)CurrName.super_IString.str._M_str + 0x18));
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
      iStack_370 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
      while (bVar3 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffc90), bVar3) {
        puVar17 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end4);
        uVar1 = *puVar17;
        while (sVar12 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2),
              sVar12 <= uVar1) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2,
                     (value_type *)auStack_1a8);
        }
        this_02 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2,
                             (ulong)uVar1);
        ::wasm::Name::operator=(this_02,(Name *)local_290);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
    }
    std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end2);
  }
  ::wasm::Name::operator=(&Inner->name,(Name *)auStack_1d8);
  this_03 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
            (Table.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 2);
  default_.super_IString.str._M_str = (char *)SwitchDefault.super_IString.str._M_len;
  default_.super_IString.str._M_len = (size_t)auStack_1a8;
  item_01 = ::wasm::Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                      (&pRStack_20->super_Builder,
                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2,default_,
                       this->SwitchCondition,(Expression *)0x0);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (this_03,(Expression *)item_01);
  CurrIf = (If *)Inner;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range2);
  std::
  map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
  ::~map((map<CFG::Block_*,_wasm::Name,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_wasm::Name>_>_>
          *)&Outer);
  std::__cxx11::string::~string((string *)local_150);
LAB_01f5f120:
  if (CurrIf != (If *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBStack_30->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)CurrIf);
  }
  ::wasm::Block::finalize(pBStack_30);
  return (Expression *)pBStack_30;
LAB_01f5e675:
  while (sVar12 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::size
                            ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&RemainingConditions
                            ), sVar12 != 0) {
    ppIVar13 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::back
                         ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&RemainingConditions);
    Base.field_2._8_8_ = *ppIVar13;
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::pop_back
              ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&RemainingConditions);
    ::wasm::If::finalize((If *)Base.field_2._8_8_);
  }
  std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::~vector
            ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&RemainingConditions);
  goto LAB_01f5f120;
}

Assistant:

wasm::Expression* Block::Render(RelooperBuilder& Builder, bool InLoop) {
  auto* Ret = Builder.makeBlock();
  if (IsCheckedMultipleEntry && InLoop) {
    Ret->list.push_back(Builder.makeSetLabel(0));
  }
  if (Code) {
    Ret->list.push_back(Code);
  }

  if (!ProcessedBranchesOut.size()) {
    Ret->finalize();
    return Ret;
  }

  // in some cases it is clear we can avoid setting label, see later
  bool SetLabel = true;

  // A setting of the label variable (label = x) is necessary if it can
  // cause an impact. The main case is where we set label to x, then elsewhere
  // we check if label is equal to that value, i.e., that label is an entry
  // in a multiple block. We also need to reset the label when we enter
  // that block, so that each setting is a one-time action: consider
  //
  //    while (1) {
  //      if (check) label = 1;
  //      if (label == 1) { label = 0 }
  //    }
  //
  // (Note that this case is impossible due to fusing, but that is not
  // material here.) So setting to 0 is important just to clear the 1 for
  // future iterations.
  // TODO: When inside a loop, if necessary clear the label variable
  //       once on the top, and never do settings that are in effect clears

  // Fusing: If the next is a Multiple, we can fuse it with this block. Note
  // that we must be the Inner of a Simple, so fusing means joining a Simple
  // to a Multiple. What happens there is that all options in the Multiple
  // *must* appear in the Simple (the Simple is the only one reaching the
  // Multiple), so we can remove the Multiple and add its independent groups
  // into the Simple's branches.
  MultipleShape* Fused = Shape::IsMultiple(Parent->Next);
  if (Fused) {
    PrintDebug("Fusing Multiple to Simple\n", 0);
    Parent->Next = Parent->Next->Next;
    // When the Multiple has the same number of groups as we have branches,
    // they will all be fused, so it is safe to not set the label at all.
    // If a switch, then we can have multiple branches to the same target
    // (in different table indexes), and so this check is not sufficient
    // TODO: optimize
    if (SetLabel && Fused->InnerMap.size() == ProcessedBranchesOut.size() &&
        !SwitchCondition) {
      SetLabel = false;
    }
  }

  // The block we branch to without checking the condition, if none of the other
  // conditions held.
  Block* DefaultTarget = nullptr;

  // Find the default target, the one without a condition
  for (auto& [Target, Details] : ProcessedBranchesOut) {
    if ((!SwitchCondition && !Details->Condition) ||
        (SwitchCondition && !Details->SwitchValues)) {
      assert(!DefaultTarget &&
             "block has branches without a default (nullptr for the "
             "condition)"); // Must be exactly one default // nullptr
      DefaultTarget = Target;
    }
  }
  // Since each Block* must* branch somewhere, this must be set
  assert(DefaultTarget);

  // root of the main part, that we are about to emit
  wasm::Expression* Root = nullptr;

  if (!SwitchCondition) {
    // We'll emit a chain of if-elses
    wasm::If* CurrIf = nullptr;

    // we build an if, then add a child, then add a child to that, etc., so we
    // must finalize them in reverse order
    std::vector<wasm::If*> finalizeStack;

    wasm::Expression* RemainingConditions = nullptr;

    for (auto iter = ProcessedBranchesOut.begin();; iter++) {
      Block* Target;
      Branch* Details;
      if (iter != ProcessedBranchesOut.end()) {
        Target = iter->first;
        if (Target == DefaultTarget) {
          continue; // done at the end
        }
        Details = iter->second;
        // must have a condition if this is not the default target
        assert(Details->Condition);
      } else {
        Target = DefaultTarget;
        Details = ProcessedBranchesOut[DefaultTarget];
      }
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      bool IsDefault = iter == ProcessedBranchesOut.end();
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // If there is nothing to show in this branch, omit the condition
      if (CurrContent) {
        if (IsDefault) {
          wasm::Expression* Now;
          if (RemainingConditions) {
            Now = Builder.makeIf(RemainingConditions, CurrContent);
            finalizeStack.push_back(Now->cast<wasm::If>());
          } else {
            Now = CurrContent;
          }
          if (!CurrIf) {
            assert(!Root);
            Root = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
          }
        } else {
          auto* Now = Builder.makeIf(Details->Condition, CurrContent);
          finalizeStack.push_back(Now);
          if (!CurrIf) {
            assert(!Root);
            Root = CurrIf = Now;
          } else {
            CurrIf->ifFalse = Now;
            CurrIf->finalize();
            CurrIf = Now;
          }
        }
      } else {
        auto* Now = Builder.makeUnary(wasm::EqZInt32, Details->Condition);
        if (RemainingConditions) {
          RemainingConditions =
            Builder.makeBinary(wasm::AndInt32, RemainingConditions, Now);
        } else {
          RemainingConditions = Now;
        }
      }
      if (IsDefault) {
        break;
      }
    }

    // finalize the if-chains
    while (finalizeStack.size() > 0) {
      wasm::If* curr = finalizeStack.back();
      finalizeStack.pop_back();
      curr->finalize();
    }

  } else {
    // Emit a switch
    auto Base = std::string("switch$") + std::to_string(Id);
    auto SwitchDefault = wasm::Name(Base + "$default");
    auto SwitchLeave = wasm::Name(Base + "$leave");
    std::map<Block*, wasm::Name> BlockNameMap;
    auto* Outer = Builder.makeBlock();
    auto* Inner = Outer;
    std::vector<wasm::Name> Table;
    for (auto& [Target, Details] : ProcessedBranchesOut) {
      wasm::Name CurrName;
      if (Details->SwitchValues) {
        CurrName = wasm::Name(Base + "$case$" + std::to_string(Target->Id));
      } else {
        CurrName = SwitchDefault;
      }
      // generate the content for this block
      bool SetCurrLabel = SetLabel && Target->IsCheckedMultipleEntry;
      bool HasFusedContent = Fused && contains(Fused->InnerMap, Target->Id);
      if (HasFusedContent) {
        assert(Details->Type == Branch::Break);
        Details->Type = Branch::Direct;
      }
      wasm::Expression* CurrContent = nullptr;
      if (SetCurrLabel || Details->Type != Branch::Direct || HasFusedContent ||
          Details->Code) {
        CurrContent = Details->Render(Builder, Target, SetCurrLabel);
        if (HasFusedContent) {
          CurrContent = Builder.blockify(
            CurrContent,
            Fused->InnerMap.find(Target->Id)->second->Render(Builder, InLoop));
        }
      }
      // generate a block to branch to, if we have content
      if (CurrContent) {
        auto* NextOuter = Builder.makeBlock();
        NextOuter->list.push_back(Outer);
        // breaking on Outer leads to the content in NextOuter
        Outer->name = CurrName;
        NextOuter->list.push_back(CurrContent);
        // if this is not a dead end, also need to break to the outside this is
        // both an optimization, and avoids incorrectness as adding a break in
        // unreachable code can make a place look reachable that isn't
        if (CurrContent->type != wasm::Type::unreachable) {
          NextOuter->list.push_back(Builder.makeBreak(SwitchLeave));
        }
        // prepare for more nesting
        Outer = NextOuter;
      } else {
        CurrName = SwitchLeave; // just go out straight from the table
        if (!Details->SwitchValues) {
          // this is the default, and it has no content. So make the default be
          // the leave
          for (auto& Value : Table) {
            if (Value == SwitchDefault) {
              Value = SwitchLeave;
            }
          }
          SwitchDefault = SwitchLeave;
        }
      }
      if (Details->SwitchValues) {
        for (auto Value : *Details->SwitchValues) {
          while (Table.size() <= Value) {
            Table.push_back(SwitchDefault);
          }
          Table[Value] = CurrName;
        }
      }
    }
    // finish up the whole pattern
    Outer->name = SwitchLeave;
    Inner->list.push_back(
      Builder.makeSwitch(Table, SwitchDefault, SwitchCondition));
    Root = Outer;
  }

  if (Root) {
    Ret->list.push_back(Root);
  }
  Ret->finalize();

  return Ret;
}